

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O0

void Abc_NtkVerifyReportErrorSeq(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int *pModel,int nFrames)

{
  int iVar1;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  int fRemove2;
  int fRemove1;
  int nPrinted;
  int iNodePo;
  int iFrameError;
  int nErrors;
  int k;
  int o;
  int i;
  uint *pPats2;
  uint *pPats1;
  int ValueError2;
  int ValueError1;
  Abc_Obj_t *pObj2;
  Abc_Obj_t *pObj1;
  Abc_Obj_t *pObjError;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vInfo2;
  Vec_Ptr_t *vInfo1;
  int nFrames_local;
  int *pModel_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  pPats1._4_4_ = 0xffffffff;
  pPats1._0_4_ = 0xffffffff;
  nPrinted = -1;
  fRemove1 = -1;
  iVar1 = Abc_NtkIsStrash(pNtk1);
  bVar5 = iVar1 == 0;
  pNtk2_local = pNtk1;
  if (bVar5) {
    pNtk2_local = Abc_NtkStrash(pNtk1,0,0,0);
  }
  iVar1 = Abc_NtkIsStrash(pNtk2);
  bVar6 = iVar1 == 0;
  pModel_local = (int *)pNtk2;
  if (bVar6) {
    pModel_local = (int *)Abc_NtkStrash(pNtk2,0,0,0);
  }
  p = Sim_SimulateSeqModel(pNtk2_local,nFrames,pModel);
  p_00 = Sim_SimulateSeqModel((Abc_Ntk_t *)pModel_local,nFrames,pModel);
  iNodePo = 0;
  pObj1 = (Abc_Obj_t *)0x0;
  k = 0;
  while ((k < nFrames && (pObj1 == (Abc_Obj_t *)0x0))) {
    for (nErrors = 0; iVar1 = Abc_NtkPoNum(pNtk2_local), nErrors < iVar1; nErrors = nErrors + 1) {
      pAVar2 = Abc_NtkPo(pNtk2_local,nErrors);
      pAVar3 = Abc_NtkPo((Abc_Ntk_t *)pModel_local,nErrors);
      if ((*(int *)((long)p->pArray[pAVar2->Id] + (long)k * 4) !=
           *(int *)((long)p_00->pArray[pAVar3->Id] + (long)k * 4)) &&
         (iNodePo = iNodePo + 1, pObj1 == (Abc_Obj_t *)0x0)) {
        nPrinted = k;
        fRemove1 = nErrors;
        pPats1._4_4_ = (uint)(*(int *)((long)p->pArray[pAVar2->Id] + (long)k * 4) != 0);
        pPats1._0_4_ = (uint)(*(int *)((long)p_00->pArray[pAVar3->Id] + (long)k * 4) != 0);
        pObj1 = pAVar2;
      }
    }
    k = k + 1;
  }
  if (pObj1 == (Abc_Obj_t *)0x0) {
    printf("No output mismatches detected.\n");
    Sim_UtilInfoFree(p);
    Sim_UtilInfoFree(p_00);
    if (bVar5) {
      Abc_NtkDelete(pNtk2_local);
    }
    if (bVar6) {
      Abc_NtkDelete((Abc_Ntk_t *)pModel_local);
    }
  }
  else {
    pcVar4 = "";
    if (1 < iNodePo) {
      pcVar4 = "s";
    }
    printf("Verification failed for at least %d output%s of frame %d: ",(ulong)(uint)iNodePo,pcVar4,
           (ulong)(nPrinted + 1));
    fRemove2 = 0;
    for (nErrors = 0; iVar1 = Abc_NtkPoNum(pNtk2_local), nErrors < iVar1; nErrors = nErrors + 1) {
      pAVar2 = Abc_NtkPo(pNtk2_local,nErrors);
      pAVar3 = Abc_NtkPo((Abc_Ntk_t *)pModel_local,nErrors);
      if (*(int *)((long)p->pArray[pAVar2->Id] + (long)nPrinted * 4) !=
          *(int *)((long)p_00->pArray[pAVar3->Id] + (long)nPrinted * 4)) {
        pcVar4 = Abc_ObjName(pAVar2);
        printf(" %s",pcVar4);
        fRemove2 = fRemove2 + 1;
        if (fRemove2 == 3) break;
      }
    }
    if (fRemove2 != iNodePo) {
      printf(" ...");
    }
    printf("\n");
    Abc_NtkGetSeqPoSupp(pNtk2_local,nPrinted,fRemove1);
    Abc_NtkGetSeqPoSupp((Abc_Ntk_t *)pModel_local,nPrinted,fRemove1);
    pcVar4 = Abc_ObjName(pObj1);
    printf("Output %s: Value in Network1 = %d. Value in Network2 = %d.\n",pcVar4,(ulong)pPats1._4_4_
           ,(ulong)(uint)pPats1);
    pcVar4 = Abc_ObjName(pObj1);
    printf("The cone of influence of output %s in Network1:\n",pcVar4);
    printf("PIs: ");
    for (k = 0; iVar1 = Abc_NtkPiNum(pNtk2_local), k < iVar1; k = k + 1) {
      pAVar2 = Abc_NtkPi(pNtk2_local,k);
      if ((pAVar2->field_6).pTemp != (void *)0x0) {
        pcVar4 = Abc_ObjName(pAVar2);
        printf("%s ",pcVar4);
      }
    }
    printf("\n");
    printf("Latches: ");
    for (k = 0; iVar1 = Vec_PtrSize(pNtk2_local->vBoxes), k < iVar1; k = k + 1) {
      pAVar2 = Abc_NtkBox(pNtk2_local,k);
      iVar1 = Abc_ObjIsLatch(pAVar2);
      if ((iVar1 != 0) && ((pAVar2->field_6).pTemp != (void *)0x0)) {
        pcVar4 = Abc_ObjName(pAVar2);
        printf("%s ",pcVar4);
      }
    }
    printf("\n");
    pcVar4 = Abc_ObjName(pObj1);
    printf("The cone of influence of output %s in Network2:\n",pcVar4);
    printf("PIs: ");
    for (k = 0; iVar1 = Abc_NtkPiNum((Abc_Ntk_t *)pModel_local), k < iVar1; k = k + 1) {
      pAVar2 = Abc_NtkPi((Abc_Ntk_t *)pModel_local,k);
      if ((pAVar2->field_6).pTemp != (void *)0x0) {
        pcVar4 = Abc_ObjName(pAVar2);
        printf("%s ",pcVar4);
      }
    }
    printf("\n");
    printf("Latches: ");
    for (k = 0; iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)(pModel_local + 0x14)), k < iVar1; k = k + 1) {
      pAVar2 = Abc_NtkBox((Abc_Ntk_t *)pModel_local,k);
      iVar1 = Abc_ObjIsLatch(pAVar2);
      if ((iVar1 != 0) && ((pAVar2->field_6).pTemp != (void *)0x0)) {
        pcVar4 = Abc_ObjName(pAVar2);
        printf("%s ",pcVar4);
      }
    }
    printf("\n");
    for (k = 0; k <= nPrinted; k = k + 1) {
      printf("Frame %d:  ",(ulong)(k + 1));
      printf("PI(1):");
      for (iFrameError = 0; iVar1 = Abc_NtkPiNum(pNtk2_local), iFrameError < iVar1;
          iFrameError = iFrameError + 1) {
        pAVar2 = Abc_NtkPi(pNtk2_local,iFrameError);
        if ((pAVar2->field_6).pTemp != (void *)0x0) {
          printf("%d",(ulong)(*(int *)((long)p->pArray[pAVar2->Id] + (long)k * 4) != 0));
        }
      }
      printf(" ");
      printf("L(1):");
      for (iFrameError = 0; iVar1 = Vec_PtrSize(pNtk2_local->vBoxes), iFrameError < iVar1;
          iFrameError = iFrameError + 1) {
        pAVar2 = Abc_NtkBox(pNtk2_local,iFrameError);
        iVar1 = Abc_ObjIsLatch(pAVar2);
        if ((iVar1 != 0) && ((pAVar2->field_6).pTemp != (void *)0x0)) {
          printf("%d",(ulong)(*(int *)((long)p->pArray[pAVar2->Id] + (long)k * 4) != 0));
        }
      }
      printf(" ");
      pcVar4 = Abc_ObjName(pObj1);
      printf("%s(1):",pcVar4);
      printf("%d",(ulong)(*(int *)((long)p->pArray[pObj1->Id] + (long)k * 4) != 0));
      printf("  ");
      printf("PI(2):");
      for (iFrameError = 0; iVar1 = Abc_NtkPiNum((Abc_Ntk_t *)pModel_local), iFrameError < iVar1;
          iFrameError = iFrameError + 1) {
        pAVar2 = Abc_NtkPi((Abc_Ntk_t *)pModel_local,iFrameError);
        if ((pAVar2->field_6).pTemp != (void *)0x0) {
          printf("%d",(ulong)(*(int *)((long)p_00->pArray[pAVar2->Id] + (long)k * 4) != 0));
        }
      }
      printf(" ");
      printf("L(2):");
      for (iFrameError = 0; iVar1 = Vec_PtrSize(*(Vec_Ptr_t **)(pModel_local + 0x14)),
          iFrameError < iVar1; iFrameError = iFrameError + 1) {
        pAVar2 = Abc_NtkBox((Abc_Ntk_t *)pModel_local,iFrameError);
        iVar1 = Abc_ObjIsLatch(pAVar2);
        if ((iVar1 != 0) && ((pAVar2->field_6).pTemp != (void *)0x0)) {
          printf("%d",(ulong)(*(int *)((long)p_00->pArray[pAVar2->Id] + (long)k * 4) != 0));
        }
      }
      printf(" ");
      pcVar4 = Abc_ObjName(pObj1);
      printf("%s(2):",pcVar4);
      printf("%d",(ulong)(*(int *)((long)p_00->pArray[pObj1->Id] + (long)k * 4) != 0));
      printf("\n");
    }
    for (k = 0; iVar1 = Abc_NtkCiNum(pNtk2_local), k < iVar1; k = k + 1) {
      pAVar2 = Abc_NtkCi(pNtk2_local,k);
      (pAVar2->field_6).pTemp = (void *)0x0;
    }
    for (k = 0; iVar1 = Abc_NtkCiNum((Abc_Ntk_t *)pModel_local), k < iVar1; k = k + 1) {
      pAVar2 = Abc_NtkCi((Abc_Ntk_t *)pModel_local,k);
      (pAVar2->field_6).pTemp = (void *)0x0;
    }
    Sim_UtilInfoFree(p);
    Sim_UtilInfoFree(p_00);
    if (bVar5) {
      Abc_NtkDelete(pNtk2_local);
    }
    if (bVar6) {
      Abc_NtkDelete((Abc_Ntk_t *)pModel_local);
    }
  }
  return;
}

Assistant:

void Abc_NtkVerifyReportErrorSeq( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int * pModel, int nFrames )
{
    Vec_Ptr_t * vInfo1, * vInfo2;
    Abc_Obj_t * pObj, * pObjError, * pObj1, * pObj2;
    int ValueError1 = -1, ValueError2 = -1;
    unsigned * pPats1, * pPats2;
    int i, o, k, nErrors, iFrameError = -1, iNodePo = -1, nPrinted;
    int fRemove1 = 0, fRemove2 = 0;

    if ( !Abc_NtkIsStrash(pNtk1) )
        fRemove1 = 1, pNtk1 = Abc_NtkStrash( pNtk1, 0, 0, 0 );
    if ( !Abc_NtkIsStrash(pNtk2) )
        fRemove2 = 1, pNtk2 = Abc_NtkStrash( pNtk2, 0, 0, 0 );

    // simulate sequential circuits
    vInfo1 = Sim_SimulateSeqModel( pNtk1, nFrames, pModel );
    vInfo2 = Sim_SimulateSeqModel( pNtk2, nFrames, pModel );

    // look for a discrepancy in the PO values
    nErrors = 0;
    pObjError = NULL;
    for ( i = 0; i < nFrames; i++ )
    {
        if ( pObjError )
            break;
        Abc_NtkForEachPo( pNtk1, pObj1, o )
        {
            pObj2  = Abc_NtkPo( pNtk2, o );
            pPats1 = Sim_SimInfoGet(vInfo1, pObj1);
            pPats2 = Sim_SimInfoGet(vInfo2, pObj2);
            if ( pPats1[i] == pPats2[i] )
                continue;
            nErrors++;
            if ( pObjError == NULL )
            {
                pObjError   = pObj1;
                iFrameError = i;
                iNodePo     = o;
                ValueError1 = (pPats1[i] > 0);
                ValueError2 = (pPats2[i] > 0);
            }
        }
    }

    if ( pObjError == NULL )
    {
        printf( "No output mismatches detected.\n" );
        Sim_UtilInfoFree( vInfo1 );
        Sim_UtilInfoFree( vInfo2 );
        if ( fRemove1 ) Abc_NtkDelete( pNtk1 );
        if ( fRemove2 ) Abc_NtkDelete( pNtk2 );
        return;
    }

    printf( "Verification failed for at least %d output%s of frame %d: ", nErrors, (nErrors>1? "s":""), iFrameError+1 );
    // print the first 3 outputs
    nPrinted = 0;
    Abc_NtkForEachPo( pNtk1, pObj1, o )
    {
        pObj2 = Abc_NtkPo( pNtk2, o );
        pPats1 = Sim_SimInfoGet(vInfo1, pObj1);
        pPats2 = Sim_SimInfoGet(vInfo2, pObj2);
        if ( pPats1[iFrameError] == pPats2[iFrameError] )
            continue;
        printf( " %s", Abc_ObjName(pObj1) );
        if ( ++nPrinted == 3 )
            break;
    }
    if ( nPrinted != nErrors )
        printf( " ..." );
    printf( "\n" );

    // mark CIs of the networks in the cone of influence of this output
    Abc_NtkGetSeqPoSupp( pNtk1, iFrameError, iNodePo );
    Abc_NtkGetSeqPoSupp( pNtk2, iFrameError, iNodePo );

    // report mismatch for the first output
    printf( "Output %s: Value in Network1 = %d. Value in Network2 = %d.\n", 
        Abc_ObjName(pObjError), ValueError1, ValueError2 );

    printf( "The cone of influence of output %s in Network1:\n", Abc_ObjName(pObjError) );
    printf( "PIs: " );
    Abc_NtkForEachPi( pNtk1, pObj, i )
        if ( pObj->pCopy )
            printf( "%s ", Abc_ObjName(pObj) );
    printf( "\n" );
    printf( "Latches: " );
    Abc_NtkForEachLatch( pNtk1, pObj, i )
        if ( pObj->pCopy )
            printf( "%s ", Abc_ObjName(pObj) );
    printf( "\n" );

    printf( "The cone of influence of output %s in Network2:\n", Abc_ObjName(pObjError) );
    printf( "PIs: " );
    Abc_NtkForEachPi( pNtk2, pObj, i )
        if ( pObj->pCopy )
            printf( "%s ", Abc_ObjName(pObj) );
    printf( "\n" );
    printf( "Latches: " );
    Abc_NtkForEachLatch( pNtk2, pObj, i )
        if ( pObj->pCopy )
            printf( "%s ", Abc_ObjName(pObj) );
    printf( "\n" );

    // print the patterns
    for ( i = 0; i <= iFrameError; i++ )
    {
        printf( "Frame %d:  ", i+1 );

        printf( "PI(1):" );
        Abc_NtkForEachPi( pNtk1, pObj, k )
            if ( pObj->pCopy )
                printf( "%d", Sim_SimInfoGet(vInfo1, pObj)[i] > 0 );
        printf( " " );
        printf( "L(1):" );
        Abc_NtkForEachLatch( pNtk1, pObj, k )
            if ( pObj->pCopy )
                printf( "%d", Sim_SimInfoGet(vInfo1, pObj)[i] > 0 );
        printf( " " );
        printf( "%s(1):", Abc_ObjName(pObjError) );
        printf( "%d", Sim_SimInfoGet(vInfo1, pObjError)[i] > 0 );

        printf( "  " );

        printf( "PI(2):" );
        Abc_NtkForEachPi( pNtk2, pObj, k )
            if ( pObj->pCopy )
                printf( "%d", Sim_SimInfoGet(vInfo2, pObj)[i] > 0 );
        printf( " " );
        printf( "L(2):" );
        Abc_NtkForEachLatch( pNtk2, pObj, k )
            if ( pObj->pCopy )
                printf( "%d", Sim_SimInfoGet(vInfo2, pObj)[i] > 0 );
        printf( " " );
        printf( "%s(2):", Abc_ObjName(pObjError) );
        printf( "%d", Sim_SimInfoGet(vInfo2, pObjError)[i] > 0 );

        printf( "\n" );
    }
    Abc_NtkForEachCi( pNtk1, pObj, i )
        pObj->pCopy = NULL;
    Abc_NtkForEachCi( pNtk2, pObj, i )
        pObj->pCopy = NULL;

    Sim_UtilInfoFree( vInfo1 );
    Sim_UtilInfoFree( vInfo2 );
    if ( fRemove1 ) Abc_NtkDelete( pNtk1 );
    if ( fRemove2 ) Abc_NtkDelete( pNtk2 );
}